

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::writePlotFile(Amr *this)

{
  bool bVar1;
  pointer pAVar2;
  size_type sVar3;
  ostream *poVar4;
  Print *in_RDI;
  string *pltfile;
  undefined1 in_stack_00000557;
  string *in_stack_00000558;
  Amr *in_stack_00000560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  Print *in_stack_fffffffffffffe00;
  Print *in_stack_fffffffffffffe70;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  
  bVar1 = Plot_Files_Output();
  if (bVar1) {
    if ((first_plotfile & 1) != 0) {
      first_plotfile = 0;
      Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                    *)in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8);
      pAVar2 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                         ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                          0x10e3a87);
      (*pAVar2->_vptr_AmrLevel[0x23])();
    }
    statePlotVars_abi_cxx11_();
    sVar3 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe00);
    if (sVar3 != 0) {
      poVar4 = (ostream *)&in_RDI[1].field_0xf8;
      Vector<int,_std::allocator<int>_>::operator[]
                ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00,
                 (size_type)in_stack_fffffffffffffdf8);
      Concatenate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      if (0 < *(int *)&in_RDI->os) {
        OutStream();
        Print::Print(in_RDI,poVar4);
        Print::operator<<(in_stack_fffffffffffffe00,(char (*) [18])in_stack_fffffffffffffdf8);
        Print::operator<<(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        Print::operator<<(in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
        Print::~Print(in_stack_fffffffffffffe70);
      }
      if ((*(int *)&in_RDI[1].field_0x140 != 0) &&
         (bVar1 = ParallelDescriptor::IOProcessor(), bVar1)) {
        poVar4 = std::operator<<((ostream *)&in_RDI[3].field_0x38,"PLOTFILE: file = ");
        poVar4 = std::operator<<(poVar4,(string *)&stack0xffffffffffffffd0);
        std::operator<<(poVar4,'\n');
      }
      writePlotFileDoit(in_stack_00000560,in_stack_00000558,(bool)in_stack_00000557);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void
Amr::writePlotFile ()
{
    if ( ! Plot_Files_Output()) {
        return;
    }

    BL_PROFILE_REGION_START("Amr::writePlotFile()");
    BL_PROFILE("Amr::writePlotFile()");

    if (first_plotfile) {
        first_plotfile = false;
        amr_level[0]->setPlotVariables();
    }

    // Don't continue if we have no variables to plot.

    if (statePlotVars().size() == 0) {
        return;
    }

    const std::string& pltfile = amrex::Concatenate(plot_file_root,
                                                    level_steps[0],
                                                    file_name_digits);

    if (verbose > 0) {
        amrex::Print() << "PLOTFILE: file = " << pltfile << '\n';
    }

    if (record_run_info && ParallelDescriptor::IOProcessor()) {
        runlog << "PLOTFILE: file = " << pltfile << '\n';
    }

    writePlotFileDoit(pltfile, true);

    BL_PROFILE_REGION_STOP("Amr::writePlotFile()");
}